

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  iterator pcVar1;
  char *in_RSI;
  SmallVectorBase<char> *in_RDI;
  char *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<char> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<char>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pcVar1 = end(in_RDI);
    *pcVar1 = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }